

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> __thiscall
qclab::dense::init_unique_array<std::complex<float>>(dense *this,int64_t size,complex<float> value)

{
  long lVar1;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> mem;
  __uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_> local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  
  local_28 = in_XMM0_Da;
  uStack_24 = in_XMM0_Db;
  alloc_unique_array<std::complex<float>>((dense *)&local_30,size);
  for (lVar1 = 0; size << 3 != lVar1; lVar1 = lVar1 + 8) {
    *(ulong *)((long)local_30._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + lVar1) =
         CONCAT44(uStack_24,local_28);
  }
  *(tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_> *)this =
       local_30._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  local_30._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
       (_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)0x0;
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &local_30);
  return (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
          )(__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
            )this;
}

Assistant:

inline auto init_unique_array( const int64_t size , const T value ) {
      auto mem = alloc_unique_array< T >( size ) ;
      std::fill( mem.get() , mem.get() + size , value ) ;
      return mem ;
    }